

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                      void *aad,size_t aadlen)

{
  int iVar1;
  ptls_fusion_aesgcm_context_t *ppVar2;
  size_t unaff_RBX;
  ulong inlen_00;
  size_t capacity;
  aesgcm_context *ctx;
  void *unaff_R12;
  undefined1 auVar3 [16];
  __m128i ctr;
  
  if (inlen < 0x10) {
    return 0xffffffffffffffff;
  }
  capacity = (inlen + aadlen) - 0x10;
  inlen_00 = inlen - 0x10;
  if (((ptls_fusion_aesgcm_context_t *)_ctx[1].algo)->capacity < capacity) {
    ppVar2 = ptls_fusion_aesgcm_set_capacity((ptls_fusion_aesgcm_context_t *)_ctx[1].algo,capacity);
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar2;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = seq;
  vpslldq_avx(auVar3,4);
  ctr[1] = aadlen;
  ctr[0] = (longlong)aad;
  iVar1 = ptls_fusion_aesgcm_decrypt
                    ((ptls_fusion_aesgcm_context_t *)_ctx[1].algo,output,input,inlen_00,ctr,
                     (void *)((long)input + inlen_00),unaff_RBX,unaff_R12);
  return -(ulong)(iVar1 == 0) | inlen_00;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aesgcm_context *ctx = (void *)_ctx;

    if (inlen < 16)
        return SIZE_MAX;

    size_t enclen = inlen - 16;
    if (enclen + aadlen > ctx->aesgcm->capacity)
        ctx->aesgcm = ptls_fusion_aesgcm_set_capacity(ctx->aesgcm, enclen + aadlen);
    if (!ptls_fusion_aesgcm_decrypt(ctx->aesgcm, output, input, enclen, calc_counter(ctx, seq), aad, aadlen,
                                    (const uint8_t *)input + enclen))
        return SIZE_MAX;
    return enclen;
}